

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_cdef_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U32 local_50;
  RK_U32 local_4c;
  RK_U32 value_5;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _err = ctx->sequence_header;
  if (((ctx->coded_lossless == 0) && (current->allow_intrabc == '\0')) &&
     (_err->enable_cdef != '\0')) {
    seq = (AV1RawSequenceHeader *)current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    value_1 = mpp_av1_read_unsigned(gb,2,"cdef_damping_minus_3",&value_2,0,3);
    ctx_local._4_4_ = value_1;
    if (-1 < (int)value_1) {
      *(undefined1 *)&seq[1].decoder_model_info.num_units_in_decoding_tick = (undefined1)value_2;
      value_1 = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,2,"cdef_bits",&value_3,0,3);
      ctx_local._4_4_ = value_1;
      if (-1 < (int)value_1) {
        *(undefined1 *)((long)&seq[1].decoder_model_info.num_units_in_decoding_tick + 1) =
             (undefined1)value_3;
        for (value = 0;
            (int)value <
            1 << (*(byte *)((long)&seq[1].decoder_model_info.num_units_in_decoding_tick + 1) & 0x1f)
            ; value = value + 1) {
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,4,"cdef_y_pri_strength[i]",&value_4,0,
                               0xf);
          if ((int)value_1 < 0) {
            return value_1;
          }
          *(char *)((long)seq[1].operating_point_idc + (long)(int)value + -6) = (char)value_4;
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,2,"cdef_y_sec_strength[i]",&value_5,0,3
                              );
          if ((int)value_1 < 0) {
            return value_1;
          }
          *(char *)((long)seq[1].operating_point_idc + (long)(int)value + 2) = (char)value_5;
          if (1 < *(int *)&gb_local[0x50].buf) {
            value_1 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,4,"cdef_uv_pri_strength[i]",&local_4c
                                 ,0,0xf);
            if ((int)value_1 < 0) {
              return value_1;
            }
            *(char *)((long)seq[1].operating_point_idc + (long)(int)value + 10) = (char)local_4c;
            value_1 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,2,"cdef_uv_sec_strength[i]",&local_50
                                 ,0,3);
            if ((int)value_1 < 0) {
              return value_1;
            }
            *(char *)((long)seq[1].operating_point_idc + (long)(int)value + 0x12) = (char)local_50;
          }
        }
        ctx_local._4_4_ = 0;
      }
    }
  }
  else {
    current->cdef_damping_minus_3 = '\0';
    current->cdef_bits = '\0';
    current->cdef_y_pri_strength[0] = '\0';
    current->cdef_y_sec_strength[0] = '\0';
    current->cdef_uv_pri_strength[0] = '\0';
    current->cdef_uv_sec_strength[0] = '\0';
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_cdef_params(AV1Context *ctx, BitReadCtx_t *gb,
                                  AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 i, err;
    if (ctx->coded_lossless || current->allow_intrabc ||
        !seq->enable_cdef) {
        infer(cdef_damping_minus_3, 0);
        infer(cdef_bits, 0);
        infer(cdef_y_pri_strength[0],  0);
        infer(cdef_y_sec_strength[0],  0);
        infer(cdef_uv_pri_strength[0], 0);
        infer(cdef_uv_sec_strength[0], 0);

        return 0;
    }

    fb(2, cdef_damping_minus_3);
    fb(2, cdef_bits);

    for (i = 0; i < (1 << current->cdef_bits); i++) {
        fbs(4, cdef_y_pri_strength[i], 1, i);
        fbs(2, cdef_y_sec_strength[i], 1, i);

        if (ctx->num_planes > 1) {
            fbs(4, cdef_uv_pri_strength[i], 1, i);
            fbs(2, cdef_uv_sec_strength[i], 1, i);
        }
    }

    return 0;
}